

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::
get_match_positions_component_prefix_dirpath
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_first;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  char *pcVar3;
  iterator_type query_last;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_last_00;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_it;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_it;
  
  query_last_00._M_current = (this->qit_basename_)._M_current;
  pcVar1 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (query_last_00._M_current != pcVar1) {
    item_first._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    item_it._M_current = (this->item_basename_)._M_current;
    do {
      _Var2._M_current = query_last_00._M_current;
      pcVar3 = item_it._M_current;
      do {
        if ((_Var2._M_current != pcVar1) && (pcVar3[-1] == _Var2._M_current[-1])) {
          _Var2._M_current = _Var2._M_current + -1;
        }
        pcVar3 = pcVar3 + -1;
      } while (pcVar3 != item_first._M_current);
      query_it._M_current = query_last_00._M_current;
      if (_Var2._M_current != query_last_00._M_current) {
        do {
          query_it._M_current = _Var2._M_current;
          if ((item_it._M_current + item_first._M_current)[-(long)item_it._M_current] ==
              *_Var2._M_current) break;
          _Var2._M_current = _Var2._M_current + 1;
          query_it._M_current = query_last_00._M_current;
        } while (_Var2._M_current != query_last_00._M_current);
      }
      item_it._M_current = item_it._M_current + item_first._M_current + -(long)item_it._M_current;
      Matcher<cpsm::NonPathTraits,cpsm::SimpleStringTraits>::
      get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                ((Matcher<cpsm::NonPathTraits,cpsm::SimpleStringTraits> *)this,posns,item_first,
                 item_it,query_it,query_last_00);
      query_last_00._M_current = query_it._M_current;
    } while (query_it._M_current != pcVar1);
  }
  return;
}

Assistant:

void get_match_positions_component_prefix_dirpath(
      std::vector<std::size_t>& posns) const {
    auto item_rit = ReverseIterator(item_basename_);
    auto const item_rlast = item_.crend();
    auto const item_first = item_.cbegin();
    auto query_rit = ReverseIterator(qit_basename_);
    auto const query_rlast = query_.crend();
    auto query_pc_last = query_rit.base();

    while (query_rit != query_rlast) {
      consume_path_component_match_front(item_rit, item_rlast, query_rit,
                                         query_rlast);
      get_match_positions_greedy(posns, item_first, item_rit.base(),
                                 query_rit.base(), query_pc_last);
      query_pc_last = query_rit.base();
    }
  }